

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O1

void Cmd_vmengine(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  EVMEngine engine;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 2) {
    pcVar2 = FCommandLine::operator[](argv,1);
    iVar1 = strcasecmp(pcVar2,"default");
    if (iVar1 == 0) {
      engine = VMEngine_Default;
    }
    else {
      pcVar2 = FCommandLine::operator[](argv,1);
      iVar1 = strcasecmp(pcVar2,"checked");
      if (iVar1 == 0) {
        engine = VMEngine_Checked;
      }
      else {
        pcVar2 = FCommandLine::operator[](argv,1);
        iVar1 = strcasecmp(pcVar2,"unchecked");
        if (iVar1 != 0) goto LAB_00350b3a;
        engine = VMEngine_Unchecked;
      }
    }
    VMSelectEngine(engine);
    return;
  }
LAB_00350b3a:
  Printf("Usage: vmengine <default|checked|unchecked>\n");
  return;
}

Assistant:

CCMD(vmengine)
{
	if (argv.argc() == 2)
	{
		if (stricmp(argv[1], "default") == 0)
		{
			VMSelectEngine(VMEngine_Default);
			return;
		}
		else if (stricmp(argv[1], "checked") == 0)
		{
			VMSelectEngine(VMEngine_Checked);
			return;
		}
		else if (stricmp(argv[1], "unchecked") == 0)
		{
			VMSelectEngine(VMEngine_Unchecked);
			return;
		}
	}
	Printf("Usage: vmengine <default|checked|unchecked>\n");
}